

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_start_domain2(mg_context *ctx,char **options,mg_error_data *error)

{
  mg_domain_context *pmVar1;
  uint uVar2;
  int iVar3;
  mg_domain_context *__ptr;
  char *pcVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  mg_domain_context *pmVar7;
  bool bVar8;
  uint line;
  undefined8 in_RCX;
  size_t sVar10;
  char *extraout_RDX;
  char *func;
  char *extraout_RDX_00;
  char *func_00;
  long lVar11;
  int iVar12;
  mg_context *ctx_00;
  char *pcVar13;
  char *pcVar14;
  mg_domain_context *pmVar9;
  
  iVar12 = -1;
  if (error == (mg_error_data *)0x0) {
    bVar8 = options == (char **)0x0 || ctx == (mg_context *)0x0;
    if (bVar8) {
      return -1;
    }
    if (ctx->stop_flag != 0) {
      return -7;
    }
  }
  else {
    error->code = 0;
    error->code_sub = 0;
    if (error->text_buffer_size != 0) {
      *error->text = '\0';
    }
    bVar8 = options == (char **)0x0 || ctx == (mg_context *)0x0;
    if (options == (char **)0x0 || ctx == (mg_context *)0x0) {
      error->code = 1;
      pcVar4 = error->text;
      sVar10 = error->text_buffer_size;
      pcVar14 = "Invalid parameters";
      goto LAB_001228f6;
    }
    if (ctx->stop_flag != 0) {
      error->code = 7;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Server already stopped");
      return -7;
    }
  }
  pmVar9 = (mg_domain_context *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar8);
  ctx_00 = (mg_context *)0x200;
  __ptr = (mg_domain_context *)calloc(1,0x200);
  pcVar4 = extraout_RDX;
  if (__ptr != (mg_domain_context *)0x0) {
    while( true ) {
      line = (uint)pmVar9;
      pcVar14 = *options;
      if (pcVar14 == (char *)0x0) {
        if (__ptr->config[0x1e] == (char *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,pcVar4,line,"%s","authentication domain required");
          if (error != (mg_error_data *)0x0) {
            error->code = 4;
            error->code_sub = 0x1e;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                        "Mandatory option %s missing","authentication_domain");
          }
          free(__ptr);
          return -4;
        }
        for (lVar11 = 0; lVar11 != 0x3a; lVar11 = lVar11 + 1) {
          pcVar4 = (ctx->dd).config[lVar11];
          bVar8 = __ptr->config[lVar11] == (char *)0x0;
          pmVar9 = (mg_domain_context *)
                   CONCAT71((int7)((ulong)pmVar9 >> 8),pcVar4 != (char *)0x0 && bVar8);
          if (pcVar4 != (char *)0x0 && bVar8) {
            pcVar4 = mg_strdup_ctx(pcVar4,ctx_00);
            __ptr->config[lVar11] = pcVar4;
            pmVar9 = __ptr;
          }
        }
        __ptr->handlers = (mg_handler_info *)0x0;
        __ptr->nonce_count = 0;
        __ptr->next = (mg_domain_context *)0x0;
        uVar5 = get_random();
        uVar6 = get_random();
        __ptr->auth_nonce_mask = uVar6 << 0x1f ^ uVar5;
        mg_lock_context(ctx);
        pcVar4 = __ptr->config[0x1e];
        iVar12 = 0;
        pmVar1 = &ctx->dd;
        do {
          pmVar7 = pmVar1;
          iVar3 = mg_strcasecmp(pcVar4,pmVar7->config[0x1e]);
          if (iVar3 == 0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,ctx,func_00,(uint)pmVar9,"domain %s already in use",
                       pcVar4);
            if (error != (mg_error_data *)0x0) {
              error->code = 5;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Domain %s specified by %s is already in use",pcVar4,
                          "authentication_domain");
            }
            free(__ptr);
            mg_unlock_context(ctx);
            return -5;
          }
          iVar12 = iVar12 + 1;
          pmVar1 = pmVar7->next;
        } while (pmVar7->next != (mg_domain_context *)0x0);
        pmVar7->next = __ptr;
        mg_unlock_context(ctx);
        return iVar12;
      }
      uVar2 = get_option_index(pcVar14);
      if (uVar2 == 0xffffffff) break;
      pcVar4 = options[1];
      if (pcVar4 == (char *)0x0) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,ctx,func,line,"%s: option value cannot be NULL",pcVar14);
        if (error == (mg_error_data *)0x0) goto LAB_00122b02;
        error->code = 2;
        error->code_sub = uVar2;
        pcVar4 = error->text;
        sVar10 = error->text_buffer_size;
        pcVar13 = "Invalid option value: %s";
        goto LAB_00122af4;
      }
      pcVar13 = __ptr->config[(int)uVar2];
      if (pcVar13 != (char *)0x0) {
        ctx_00 = ctx;
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,ctx,func,line,"warning: %s: duplicate option",pcVar14);
        free(pcVar13);
      }
      pcVar4 = mg_strdup_ctx(pcVar4,ctx_00);
      __ptr->config[(int)uVar2] = pcVar4;
      options = options + 2;
      pmVar9 = __ptr;
      pcVar4 = extraout_RDX_00;
    }
    mg_cry_internal_wrap((mg_connection *)0x0,ctx,func,line,"Invalid option: %s",pcVar14);
    if (error == (mg_error_data *)0x0) goto LAB_00122b02;
    error->code = 2;
    error->code_sub = 0xffffffff;
    pcVar4 = error->text;
    sVar10 = error->text_buffer_size;
    pcVar13 = "Invalid option: %s";
LAB_00122af4:
    mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar4,sVar10,pcVar13,pcVar14);
LAB_00122b02:
    free(__ptr);
    return -2;
  }
  iVar12 = -6;
  if (error == (mg_error_data *)0x0) {
    return -6;
  }
  error->code = 6;
  error->code_sub = 0x200;
  pcVar4 = error->text;
  sVar10 = error->text_buffer_size;
  pcVar14 = "Out or memory";
LAB_001228f6:
  mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar4,sVar10,"%s",pcVar14);
  return iVar12;
}

Assistant:

CIVETWEB_API int
mg_start_domain2(struct mg_context *ctx,
                 const char **options,
                 struct mg_error_data *error)
{
	const char *name;
	const char *value;
	const char *default_value;
	struct mg_domain_context *new_dom;
	struct mg_domain_context *dom;
	int idx, i;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if ((ctx == NULL) || (options == NULL)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PARAM;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Invalid parameters");
		}
		return -1;
	}

	if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_SERVER_STOPPED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Server already stopped");
		}
		return -7;
	}

	new_dom = (struct mg_domain_context *)
	    mg_calloc_ctx(1, sizeof(struct mg_domain_context), ctx);

	if (!new_dom) {
		/* Out of memory */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(struct mg_domain_context);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out or memory");
		}
		return -6;
	}

	/* Store options - TODO: unite duplicate code */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option value: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		}
		if (new_dom->config[idx] != NULL) {
			/* Duplicate option: Later values overwrite earlier ones. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(new_dom->config[idx]);
		}
		new_dom->config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Authentication domain is mandatory */
	/* TODO: Maybe use a new option hostname? */
	if (!new_dom->config[AUTHENTICATION_DOMAIN]) {
		mg_cry_ctx_internal(ctx, "%s", "authentication domain required");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_MISSING_OPTION;
			error->code_sub = AUTHENTICATION_DOMAIN;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Mandatory option %s missing",
			            config_options[AUTHENTICATION_DOMAIN].name);
		}
		mg_free(new_dom);
		return -4;
	}

	/* Set default value if needed. Take the config value from
	 * ctx as a default value. */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = ctx->dd.config[i];
		if ((new_dom->config[i] == NULL) && (default_value != NULL)) {
			new_dom->config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	new_dom->handlers = NULL;
	new_dom->next = NULL;
	new_dom->nonce_count = 0;
	new_dom->auth_nonce_mask = get_random() ^ (get_random() << 31);

#if defined(USE_LUA) && defined(USE_WEBSOCKET)
	new_dom->shared_lua_websockets = NULL;
#endif

#if !defined(NO_SSL) && !defined(USE_MBEDTLS)
	if (!init_ssl_ctx(ctx, new_dom)) {
		/* Init SSL failed */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Initializing SSL context failed");
		}
		mg_free(new_dom);
		return -3;
	}
#endif

	/* Add element to linked list. */
	mg_lock_context(ctx);

	idx = 0;
	dom = &(ctx->dd);
	for (;;) {
		if (!mg_strcasecmp(new_dom->config[AUTHENTICATION_DOMAIN],
		                   dom->config[AUTHENTICATION_DOMAIN])) {
			/* Domain collision */
			mg_cry_ctx_internal(ctx,
			                    "domain %s already in use",
			                    new_dom->config[AUTHENTICATION_DOMAIN]);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_DUPLICATE_DOMAIN;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Domain %s specified by %s is already in use",
				            new_dom->config[AUTHENTICATION_DOMAIN],
				            config_options[AUTHENTICATION_DOMAIN].name);
			}
			mg_free(new_dom);
			mg_unlock_context(ctx);
			return -5;
		}

		/* Count number of domains */
		idx++;

		if (dom->next == NULL) {
			dom->next = new_dom;
			break;
		}
		dom = dom->next;
	}

	mg_unlock_context(ctx);

	/* Return domain number */
	return idx;
}